

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O0

size_t bitsToChunks(size_t chunkLenBits,uint8_t *input,size_t inputLen,uint16_t *chunks)

{
  byte bVar1;
  long in_RCX;
  long in_RDX;
  uint8_t *in_RSI;
  ulong in_RDI;
  size_t j;
  size_t i;
  size_t chunkCount;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_8;
  
  if ((in_RDI == 0) || ((ulong)(in_RDX << 3) < in_RDI)) {
    local_8 = 0;
  }
  else {
    local_8 = (ulong)(in_RDX << 3) / in_RDI;
    for (local_38 = 0; local_38 < local_8; local_38 = local_38 + 1) {
      *(undefined2 *)(in_RCX + local_38 * 2) = 0;
      for (local_40 = 0; local_40 < in_RDI; local_40 = local_40 + 1) {
        bVar1 = getBit(in_RSI,local_38 * in_RDI + local_40);
        *(ushort *)(in_RCX + local_38 * 2) =
             *(short *)(in_RCX + local_38 * 2) + ((ushort)bVar1 << ((byte)local_40 & 0x1f));
      }
    }
  }
  return local_8;
}

Assistant:

static size_t bitsToChunks(size_t chunkLenBits, const uint8_t* input, size_t inputLen,
                           uint16_t* chunks) {
  if (!chunkLenBits || chunkLenBits > inputLen * 8) {
    assert(!"Invalid input to bitsToChunks: not enough input");
    return 0;
  }
  size_t chunkCount = ((inputLen * 8) / chunkLenBits);

  for (size_t i = 0; i < chunkCount; i++) {
    chunks[i] = 0;
    for (size_t j = 0; j < chunkLenBits; j++) {
      chunks[i] += getBit(input, i * chunkLenBits + j) << j;
      assert(chunks[i] < (1 << chunkLenBits));
    }
  }

  return chunkCount;
}